

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O3

int deal_ws_request(int new_fd,sockaddr_in *client_addr,int shm_id,int i,int write_fd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ws_request *req;
  char *pcVar5;
  ssize_t sVar6;
  long lVar7;
  ulong uVar8;
  timeval timeout;
  fd_set read_set;
  char recv_buf [1025];
  timeval local_4c8;
  fd_set local_4b8;
  char local_438 [1032];
  
  printf("%d");
  pvVar4 = shmat(shm_id,(void *)0x0,0);
  if (pvVar4 == (void *)0xffffffffffffffff) {
    pcVar5 = "Cannot link sharing memory to this process!(Game server)";
LAB_00104a5e:
    puts(pcVar5);
LAB_00104a63:
    iVar3 = -1;
  }
  else {
    lVar7 = (long)i * 0xec;
    iVar3 = *(int *)((long)pvVar4 + lVar7);
    memset(local_438,0,0x401);
    local_4b8.fds_bits[0xe] = 0;
    local_4b8.fds_bits[0xf] = 0;
    local_4b8.fds_bits[0xc] = 0;
    local_4b8.fds_bits[0xd] = 0;
    local_4b8.fds_bits[10] = 0;
    local_4b8.fds_bits[0xb] = 0;
    local_4b8.fds_bits[8] = 0;
    local_4b8.fds_bits[9] = 0;
    local_4b8.fds_bits[6] = 0;
    local_4b8.fds_bits[7] = 0;
    local_4b8.fds_bits[4] = 0;
    local_4b8.fds_bits[5] = 0;
    local_4b8.fds_bits[2] = 0;
    local_4b8.fds_bits[3] = 0;
    local_4b8.fds_bits[0] = 0;
    local_4b8.fds_bits[1] = 0;
    iVar2 = new_fd + 0x3f;
    if (-1 < new_fd) {
      iVar2 = new_fd;
    }
    uVar8 = 1L << ((byte)(new_fd % 0x40) & 0x3f);
    local_4b8.fds_bits[iVar2 >> 6] = local_4b8.fds_bits[iVar2 >> 6] | uVar8;
    local_4c8.tv_sec = 10;
    local_4c8.tv_usec = 0;
    req = (ws_request *)malloc(0x10f8);
    pcVar5 = inet_ntoa((in_addr)(client_addr->sin_addr).s_addr);
    strcpy(req->address,pcVar5);
    req->port = (uint)client_addr->sin_port;
    req->client_socket = new_fd;
    req->method_right_state = false;
    while (iVar1 = select(new_fd + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8), iVar1 != 0)
    {
      if (iVar1 == -1) {
        pcVar5 = "Cannot select read_fd!";
LAB_00104a83:
        perror(pcVar5);
        goto LAB_00104a63;
      }
      if ((local_4b8.fds_bits[iVar2 >> 6] & uVar8) != 0) {
        sVar6 = recv(new_fd,local_438,0x4000,0);
        if ((int)sVar6 == 0) {
          return 0;
        }
        if ((int)sVar6 < 0) {
          pcVar5 = "Read request failure!";
          goto LAB_00104a83;
        }
        printf("\n%s\n",local_438);
        iVar2 = is_ws_request(local_438,req);
        if (iVar2 == -1) {
          pcVar5 = "WebSocket request is illegal!";
          goto LAB_00104a5e;
        }
        iVar2 = do_ws_response(req);
        if (iVar2 == -1) {
          pcVar5 = "Send WebSocket response failure!";
          goto LAB_00104a5e;
        }
        analyGame(req->uri,(char *)((long)pvVar4 + lVar7 + 9),(int *)((long)pvVar4 + lVar7 + 0x1c));
        iVar3 = webSocket_session(new_fd,write_fd,iVar3,i);
        if (iVar3 == -1) {
          pcVar5 = "Pipe is broken";
          goto LAB_00104a5e;
        }
        if (iVar3 != 1) {
          pcVar5 = "Unknow error!";
          goto LAB_00104a5e;
        }
        pcVar5 = "WebSocket session is close!";
        goto LAB_00104a42;
      }
      perror("FD set happen crash!");
    }
    pcVar5 = "Listen time out!";
LAB_00104a42:
    puts(pcVar5);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int deal_ws_request(int new_fd, struct sockaddr_in *client_addr, int shm_id, int i, int write_fd){
    struct PIPE *pipes;
    printf("%d", shm_id);
    pipes = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(pipes == -1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }

    int read_fd = pipes[i].pipe[0];

    char recv_buf[HEAD_MAX_SIZE + 1] = "";
    char send_buf[HEAD_MAX_SIZE + 1] = "";

    int read_byte = 0;
    int file_byte = 0;


    fd_set read_set;
    FD_ZERO(&read_set);
    FD_SET(new_fd, &read_set);

    struct timeval timeout;
    timeout.tv_sec = TIME_OUT_SEC;
    timeout.tv_usec = TIME_OUT_USEC;

    struct ws_request *req
            = (struct ws_request *)malloc(sizeof(struct ws_request));
    strcpy(req->address, inet_ntoa(client_addr->sin_addr));
    req->port = client_addr->sin_port;
    req->client_socket = new_fd;
    req->method_right_state = false;

    int resel = 0;
    int maxfd = new_fd+1;

    while(true){
        resel = select(maxfd, &read_set, NULL, NULL, &timeout);
        switch (resel) {
            case -1:
                perror("Cannot select read_fd!");
                return -1;
            case 0:
                printf("Listen time out!\n");
                return 1;
            default:
                if(FD_ISSET(new_fd, &read_set)){
                    read_byte = (int)recv(new_fd, recv_buf, 16384, 0);
                    if(read_byte == 0){
                        return 0;     //connect interrupt!
                    } else if(read_byte < 0) {
                        perror("Read request failure!");
                        return -1;
                    } else {
                        printf("\n%s\n",recv_buf);
                        if(is_ws_request(recv_buf,req) == -1){
                            printf("WebSocket request is illegal!\n");
                            return -1;
                        }
                        if(do_ws_response(req) == -1){
                            printf("Send WebSocket response failure!\n");
                            return -1;
                        }
                        if(analyGame(req->uri, pipes[i].name, &(pipes[i].level))  == -1){
                            printf("Game name analysis error\n");
                            return -1;
                        }
                        switch (webSocket_session(new_fd, write_fd, read_fd, i)){
                            case 1:
                                printf("WebSocket session is close!\n");
                                return 1;
                            case -1:
                                printf("Pipe is broken\n");
                                return -1;
                            default:
                                printf("Unknow error!\n");
                                return -1;
                        }
                        return 1;
                    }
                } else {
                    perror("FD set happen crash!");
                    continue;
                }
        }
    }
}